

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O1

int move_messages_between_lists(SINGLYLINKEDLIST_HANDLE from_list,SINGLYLINKEDLIST_HANDLE to_list)

{
  bool bVar1;
  int iVar2;
  LIST_ITEM_HANDLE pLVar3;
  void *item;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  int iVar6;
  
  iVar6 = 0;
  do {
    pLVar3 = singlylinkedlist_get_head_item(from_list);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      return iVar6;
    }
    item = singlylinkedlist_item_get_value(pLVar3);
    iVar2 = singlylinkedlist_remove(from_list,pLVar3);
    if (iVar2 == 0) {
      if (item == (void *)0x0) {
        p_Var4 = xlogging_get_log_function();
        iVar6 = 0x17d;
        if (p_Var4 != (LOGGER_LOG)0x0) {
          iVar2 = 0x17c;
          pcVar5 = "failed moving message to list";
          goto LAB_00140add;
        }
      }
      else {
        pLVar3 = singlylinkedlist_add(to_list,item);
        bVar1 = true;
        if (pLVar3 != (LIST_ITEM_HANDLE)0x0) goto LAB_00140b8f;
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"move_messages_between_lists",0x182,1,"failed moving message to list");
        }
        if (*(code **)((long)item + 0x10) != (code *)0x0) {
          (**(code **)((long)item + 0x10))
                    (*(undefined8 *)((long)item + 8),4,0,*(undefined8 *)((long)item + 0x18));
        }
        free(item);
        iVar6 = 0x185;
      }
LAB_00140b8d:
      bVar1 = false;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      iVar6 = 0x177;
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00140b8d;
      iVar2 = 0x176;
      pcVar5 = "failed removing message from list";
LAB_00140add:
      bVar1 = false;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"move_messages_between_lists",iVar2,1,pcVar5);
    }
LAB_00140b8f:
    if (!bVar1) {
      return iVar6;
    }
  } while( true );
}

Assistant:

static int move_messages_between_lists(SINGLYLINKEDLIST_HANDLE from_list, SINGLYLINKEDLIST_HANDLE to_list)
{
    int result;
    LIST_ITEM_HANDLE list_item;

    result = RESULT_OK;

    while ((list_item = singlylinkedlist_get_head_item(from_list)) != NULL)
    {
        MESSAGE_QUEUE_ITEM* mq_item = (MESSAGE_QUEUE_ITEM*)singlylinkedlist_item_get_value(list_item);

        if (singlylinkedlist_remove(from_list, list_item) != 0)
        {
            LogError("failed removing message from list");
            result = MU_FAILURE;
            break;
        }
        else if (mq_item == NULL)
        {
            LogError("failed moving message to list");
            result = MU_FAILURE;
            break;
        }
        else if (singlylinkedlist_add(to_list, (const void*)mq_item) == NULL)
        {
            LogError("failed moving message to list");
            fire_message_callback(mq_item, MESSAGE_QUEUE_CANCELLED, NULL);
            free(mq_item);
            result = MU_FAILURE;
            break;
        }
    }

    return result;
}